

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlUnregisterInputCallback(PyObject *self,PyObject *args)

{
  int iVar1;
  int ret;
  PyObject *args_local;
  PyObject *self_local;
  
  iVar1 = xmlPopInputCallbacks();
  if (pythonInputCallbackID == -1) {
    if (iVar1 == -1) {
      PyErr_SetString(_PyExc_IndexError,"no input callbacks to pop");
      return (PyObject *)0x0;
    }
  }
  else {
    if (pythonInputCallbackID != iVar1) {
      PyErr_SetString(_PyExc_AssertionError,"popped non-python input callback");
      return (PyObject *)0x0;
    }
    pythonInputCallbackID = -1;
    _Py_DECREF(pythonInputOpenCallbackObject);
    pythonInputOpenCallbackObject = (PyObject *)0x0;
  }
  _Py_INCREF((PyObject *)&_Py_NoneStruct);
  self_local = (PyObject *)&_Py_NoneStruct;
  return self_local;
}

Assistant:

PyObject *
libxml_xmlUnregisterInputCallback(ATTRIBUTE_UNUSED PyObject *self,
                                ATTRIBUTE_UNUSED PyObject *args) {
    int ret;

    ret = xmlPopInputCallbacks();
    if (pythonInputCallbackID != -1) {
	/* Assert that the right input callback was popped. libxml's API does not
	 * allow removal by ID, so all that could be done is an assert.  */
	if (pythonInputCallbackID == ret) {
	    pythonInputCallbackID = -1;
	    Py_DECREF(pythonInputOpenCallbackObject);
	    pythonInputOpenCallbackObject = NULL;
	} else {
	    PyErr_SetString(PyExc_AssertionError, "popped non-python input callback");
	    return(NULL);
	}
    } else if (ret == -1) {
	/* No more callbacks to pop */
	PyErr_SetString(PyExc_IndexError, "no input callbacks to pop");
	return(NULL);
    }

    Py_INCREF(Py_None);
    return(Py_None);
}